

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license++.cpp
# Opt level: O3

EVENT_TYPE acquire_license(char *product,LicenseLocation licenseLocation,LicenseInfo *license)

{
  bool bVar1;
  AuditEvent *pAVar2;
  EVENT_TYPE EVar3;
  string *this;
  pointer this_00;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *this_01;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenses;
  EventRegistry er;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenses_with_errors;
  EventRegistry validation_er;
  LicenseReader lr;
  string local_108;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> local_e8;
  EventRegistry local_d0;
  string local_b8;
  EventRegistry local_98;
  LicenseReader local_80;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> local_60;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> local_48;
  
  ::license::LicenseReader::LicenseReader(&local_80,&licenseLocation);
  local_e8.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
  local_e8.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
  local_e8.super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_b8,product,(allocator *)&local_108);
  ::license::LicenseReader::readLicenses(&local_d0,&local_80,&local_b8,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_e8.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_e8.
      super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pAVar2 = ::license::EventRegistry::getLastFailure(&local_d0);
    EVar3 = pAVar2->event_type;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    this_00 = local_e8.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      ::license::FullLicenseInfo::validate(&local_98,this_00,0);
      bVar1 = ::license::EventRegistry::isGood(&local_98);
      this = &local_108;
      if (!bVar1) {
        this = &local_b8;
      }
      std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::push_back
                ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)this
                 ,this_00);
      ::license::EventRegistry::append(&local_d0,&local_98);
      if (local_98.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             local_e8.
             super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if ((pointer)local_108._M_string_length == local_108._M_dataplus._M_p) {
      pAVar2 = ::license::EventRegistry::getLastFailure(&local_d0);
      EVar3 = pAVar2->event_type;
      this_01 = &local_60;
      std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
                (this_01,(vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                          *)&local_b8);
      mergeLicenses(this_01,license);
    }
    else {
      ::license::EventRegistry::turnErrosIntoWarnings(&local_d0);
      this_01 = &local_48;
      std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::vector
                (this_01,(vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
                          *)&local_108);
      EVar3 = LICENSE_OK;
      mergeLicenses(this_01,license);
    }
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              (this_01);
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
               &local_108);
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              ((vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> *)
               &local_b8);
  }
  if (license != (LicenseInfo *)0x0) {
    ::license::EventRegistry::exportLastEvents(&local_d0,license->status,5);
  }
  if (local_d0.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.logs.super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
            (&local_e8);
  ::license::LicenseReader::~LicenseReader(&local_80);
  return EVar3;
}

Assistant:

EVENT_TYPE acquire_license(const char * product,
		LicenseLocation licenseLocation, LicenseInfo* license) {
	license::LicenseReader lr = license::LicenseReader(licenseLocation);
	vector<license::FullLicenseInfo> licenses;
	license::EventRegistry er = lr.readLicenses(string(product), licenses);
	EVENT_TYPE result;
	if (licenses.size() > 0) {
		vector<license::FullLicenseInfo> licenses_with_errors;
		vector<license::FullLicenseInfo> licenses_ok;
		for (auto it = licenses.begin(); it != licenses.end(); it++) {
			license::EventRegistry validation_er = it->validate(0);
			if (validation_er.isGood()) {
				licenses_ok.push_back(*it);
			} else {
				licenses_with_errors.push_back(*it);
			}
			er.append(validation_er);
		}
		if (licenses_ok.size() > 0) {
			er.turnErrosIntoWarnings();
			result = LICENSE_OK;
			mergeLicenses(licenses_ok, license);
		} else {
			result = er.getLastFailure()->event_type;
			mergeLicenses(licenses_with_errors, license);
		}

	} else {
		result = er.getLastFailure()->event_type;
	}
	if (license != NULL) {
		er.exportLastEvents(license->status, 5);
	}
	return result;
}